

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::IfcMemberType(IfcMemberType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008278a0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcMemberType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__0088fce8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x88fbb8;
  *(undefined8 *)&this->field_0x1c0 = 0x88fcd0;
  *(undefined8 *)&this->field_0x88 = 0x88fbe0;
  *(undefined8 *)&this->field_0x98 = 0x88fc08;
  *(undefined8 *)&this->field_0xf0 = 0x88fc30;
  *(undefined8 *)&this->field_0x148 = 0x88fc58;
  *(undefined8 *)&this->field_0x180 = 0x88fc80;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x88fca8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}